

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::
     checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<long> expected)

{
  long a;
  uint uVar1;
  size_type sVar2;
  const_iterator plVar3;
  long b;
  uint local_40;
  uint i;
  uint local_2c;
  size_type local_28;
  Fault local_20;
  Fault f;
  initializer_list<long> expected_local;
  
  f.exception = (Exception *)expected._M_array;
  sVar2 = std::initializer_list<long>::size((initializer_list<long> *)&f);
  uVar1 = List<long,_(capnp::Kind)0>::Builder::size(&reader);
  if (sVar2 == uVar1) {
    local_40 = 0;
    while( true ) {
      sVar2 = std::initializer_list<long>::size((initializer_list<long> *)&f);
      if (sVar2 <= local_40) break;
      plVar3 = std::initializer_list<long>::begin((initializer_list<long> *)&f);
      a = plVar3[local_40];
      b = List<long,_(capnp::Kind)0>::Builder::operator[](&reader,local_40);
      checkElement<long>(a,b);
      local_40 = local_40 + 1;
    }
    return;
  }
  local_28 = std::initializer_list<long>::size((initializer_list<long> *)&f);
  local_2c = List<long,_(capnp::Kind)0>::Builder::size(&reader);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_28,&local_2c);
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}